

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.c
# Opt level: O0

void cSetRWork(int m,int panel_size,singlecomplex *dworkptr,singlecomplex **dense,
              singlecomplex **tempv)

{
  int iVar1;
  int iVar2;
  int local_4c;
  int local_40;
  int rowblk;
  int maxsuper;
  singlecomplex zero;
  singlecomplex **tempv_local;
  singlecomplex **dense_local;
  singlecomplex *dworkptr_local;
  int panel_size_local;
  int m_local;
  
  zero = (singlecomplex)tempv;
  memset(&rowblk,0,8);
  iVar1 = sp_ienv(3);
  iVar2 = sp_ienv(7);
  if (iVar2 < iVar1) {
    local_40 = sp_ienv(3);
  }
  else {
    local_40 = sp_ienv(7);
  }
  iVar1 = sp_ienv(4);
  *dense = dworkptr;
  *(singlecomplex **)zero = *dense + panel_size * m;
  cfill(*dense,m * panel_size,_rowblk);
  local_4c = m;
  if (m <= (local_40 + iVar1) * panel_size) {
    local_4c = (local_40 + iVar1) * panel_size;
  }
  cfill(*(singlecomplex **)zero,local_4c,_rowblk);
  return;
}

Assistant:

void
cSetRWork(int m, int panel_size, singlecomplex *dworkptr,
	 singlecomplex **dense, singlecomplex **tempv)
{
    singlecomplex zero = {0.0, 0.0};

    int maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) ),
        rowblk   = sp_ienv(4);
    *dense = dworkptr;
    *tempv = *dense + panel_size*m;
    cfill (*dense, m * panel_size, zero);
    cfill (*tempv, NUM_TEMPV(m,panel_size,maxsuper,rowblk), zero);     
}